

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

void increment_index(void)

{
  bool bVar1;
  
  if (argv_index < argv_index2) {
    do {
      argv_index = argv_index + 1;
      bVar1 = false;
      if ((prev_argv[argv_index] != (char *)0x0) && (bVar1 = false, *prev_argv[argv_index] != '-'))
      {
        bVar1 = argv_index < argv_index2 + 1;
      }
    } while (bVar1);
  }
  else {
    argv_index = argv_index + 1;
  }
  opt_offset = 1;
  return;
}

Assistant:

static void increment_index()
{
	/* Move onto the next option */
	if(argv_index < argv_index2)
	{
		while(prev_argv[++argv_index] && prev_argv[argv_index][0] != '-'
				&& argv_index < argv_index2+1);
	}
	else argv_index++;
	opt_offset = 1;
}